

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall ON_BrepFace::SetMesh(ON_BrepFace *this,mesh_type mt,ON_Mesh *mesh)

{
  int iVar1;
  recursive_mutex *__mutex;
  bool bVar2;
  Impl *this_00;
  
  __mutex = &this->m_pImpl->m_mesh_mutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (mt == preview_mesh) {
    this_00 = (Impl *)&this->m_pImpl->m_preview_mesh;
  }
  else if (mt == analysis_mesh) {
    this_00 = (Impl *)&this->m_pImpl->m_analysis_mesh;
  }
  else {
    if (mt != render_mesh) {
      bVar2 = false;
      goto LAB_003eb6e3;
    }
    this_00 = this->m_pImpl;
  }
  bVar2 = true;
  std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset<ON_Mesh>
            ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)this_00,mesh);
LAB_003eb6e3:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return bVar2;
}

Assistant:

bool ON_BrepFace::SetMesh(ON::mesh_type mt, ON_Mesh* mesh)
{
  std::lock_guard<std::recursive_mutex> lock(m_pImpl->m_mesh_mutex);

  bool rc = true;
  switch (mt)
  {
  case ON::render_mesh:
    m_pImpl->m_render_mesh.reset(mesh);
    break;
  case ON::analysis_mesh:
    m_pImpl->m_analysis_mesh.reset(mesh);
    break;
  case ON::preview_mesh:
    m_pImpl->m_preview_mesh.reset(mesh);
    break;
  default:
    rc = false;
  }

  return rc;
}